

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

int SSL_CTX_set1_tls_channel_id(SSL_CTX *ctx,EVP_PKEY *private_key)

{
  int iVar1;
  unique_ptr<evp_pkey_st,_bssl::internal::Deleter> local_28;
  EVP_PKEY *local_20;
  EVP_PKEY *private_key_local;
  SSL_CTX *ctx_local;
  
  local_20 = private_key;
  private_key_local = (EVP_PKEY *)ctx;
  iVar1 = is_p256_key(private_key);
  if (iVar1 != 0) {
    bssl::UpRef((bssl *)&local_28,local_20);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::operator=
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&private_key_local[0x17].pkey,
               &local_28);
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&local_28);
  }
  else {
    ERR_put_error(0x10,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x927);
  }
  ctx_local._4_4_ = (uint)(iVar1 != 0);
  return ctx_local._4_4_;
}

Assistant:

int SSL_CTX_set1_tls_channel_id(SSL_CTX *ctx, EVP_PKEY *private_key) {
  if (!is_p256_key(private_key)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CHANNEL_ID_NOT_P256);
    return 0;
  }

  ctx->channel_id_private = UpRef(private_key);
  return 1;
}